

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O2

void __thiscall llvm::DWARFGdbIndex::dumpSymbolTable(DWARFGdbIndex *this,raw_ostream *OS)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  raw_ostream *this_00;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  format_object_base local_50;
  undefined8 local_40;
  char *local_38;
  
  local_40 = (ulong)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                    super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                    super_SmallVectorBase.Size;
  local_50.Fmt = "\n  Symbol table offset = 0x%x, size = %ld, filled slots:";
  local_50._vptr_format_object_base = (_func_int **)&PTR_home_01127d90;
  local_38 = (char *)CONCAT44(local_38._4_4_,this->SymbolTableOffset);
  this_00 = raw_ostream::operator<<(OS,&local_50);
  raw_ostream::operator<<(this_00,'\n');
  piVar12 = (int *)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                   super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                   super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                   super_SmallVectorBase.BeginX;
  piVar1 = piVar12 + (ulong)(this->SymbolTable).
                            super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                            super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                            super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>
                            .super_SmallVectorBase.Size * 2;
  iVar13 = -1;
  do {
    if (piVar12 == piVar1) {
      return;
    }
    iVar13 = iVar13 + 1;
    local_40._4_4_ = *piVar12;
    local_40._0_4_ = piVar12[1];
    if (local_40._4_4_ != 0 || (int)local_40 != 0) {
      local_50.Fmt = "    %d: Name offset = 0x%x, CU vector offset = 0x%x\n";
      local_50._vptr_format_object_base = (_func_int **)&PTR_home_01128218;
      local_38 = (char *)CONCAT44(local_38._4_4_,iVar13);
      raw_ostream::operator<<(OS,&local_50);
      uVar9 = (ulong)((this->ConstantPoolOffset - this->StringPoolOffset) + *piVar12);
      uVar11 = (this->ConstantPoolStrings).Length;
      if (uVar11 < uVar9) {
        uVar9 = uVar11;
      }
      pvVar3 = (this->ConstantPoolVectors).
               super_SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_>
               .
               super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
               .super_SmallVectorBase.BeginX;
      uVar2 = (this->ConstantPoolVectors).
              super_SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_>.
              super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
              .super_SmallVectorBase.Size;
      lVar5 = (ulong)uVar2 * 0x18;
      uVar10 = (ulong)(uVar2 >> 2);
      piVar8 = (int *)((long)pvVar3 + uVar10 * 0x60);
      piVar7 = (int *)((long)pvVar3 + 0x30);
      for (uVar11 = uVar10; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
        iVar4 = piVar12[1];
        if (piVar7[-0xc] == iVar4) {
          piVar7 = piVar7 + -0xc;
          goto LAB_00d9c473;
        }
        if (piVar7[-6] == iVar4) {
          piVar7 = piVar7 + -6;
          goto LAB_00d9c473;
        }
        if (*piVar7 == iVar4) goto LAB_00d9c473;
        if (piVar7[6] == iVar4) {
          piVar7 = piVar7 + 6;
          goto LAB_00d9c473;
        }
        piVar7 = piVar7 + 0x18;
      }
      lVar6 = (long)(lVar5 + uVar10 * -0x60) / 0x18;
      if (lVar6 == 3) {
        iVar4 = piVar12[1];
        piVar7 = piVar8;
        if (*piVar8 != iVar4) {
          piVar8 = piVar8 + 6;
          goto LAB_00d9c4c9;
        }
      }
      else {
        if (lVar6 == 2) {
          iVar4 = piVar12[1];
LAB_00d9c4c9:
          piVar7 = piVar8;
          if (*piVar8 == iVar4) goto LAB_00d9c473;
          piVar8 = piVar8 + 6;
        }
        else {
          if (lVar6 != 1) goto LAB_00d9c4d5;
          iVar4 = piVar12[1];
        }
        piVar7 = piVar8;
        if (*piVar8 != iVar4) goto LAB_00d9c4d5;
      }
LAB_00d9c473:
      if (piVar7 == (int *)((long)pvVar3 + lVar5)) {
LAB_00d9c4d5:
        __assert_fail("CuVector != ConstantPoolVectors.end() && \"Invalid symbol table\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFGdbIndex.cpp"
                      ,0x4f,"void llvm::DWARFGdbIndex::dumpSymbolTable(raw_ostream &) const");
      }
      local_50.Fmt = "      String name: %s, CU vector index: %d\n";
      local_50._vptr_format_object_base = (_func_int **)&PTR_home_01128728;
      local_40 = CONCAT44(local_40._4_4_,(int)(((long)piVar7 - (long)pvVar3) / 0x18));
      local_38 = (this->ConstantPoolStrings).Data + uVar9;
      raw_ostream::operator<<(OS,&local_50);
    }
    piVar12 = piVar12 + 2;
  } while( true );
}

Assistant:

void DWARFGdbIndex::dumpSymbolTable(raw_ostream &OS) const {
  OS << format("\n  Symbol table offset = 0x%x, size = %" PRId64
               ", filled slots:",
               SymbolTableOffset, (uint64_t)SymbolTable.size())
     << '\n';
  uint32_t I = -1;
  for (const SymTableEntry &E : SymbolTable) {
    ++I;
    if (!E.NameOffset && !E.VecOffset)
      continue;

    OS << format("    %d: Name offset = 0x%x, CU vector offset = 0x%x\n", I,
                 E.NameOffset, E.VecOffset);

    StringRef Name = ConstantPoolStrings.substr(
        ConstantPoolOffset - StringPoolOffset + E.NameOffset);

    auto CuVector = std::find_if(
        ConstantPoolVectors.begin(), ConstantPoolVectors.end(),
        [&](const std::pair<uint32_t, SmallVector<uint32_t, 0>> &V) {
          return V.first == E.VecOffset;
        });
    assert(CuVector != ConstantPoolVectors.end() && "Invalid symbol table");
    uint32_t CuVectorId = CuVector - ConstantPoolVectors.begin();
    OS << format("      String name: %s, CU vector index: %d\n", Name.data(),
                 CuVectorId);
  }
}